

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce_load_size.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ReduceLoadSize::ShouldReplaceExtract(ReduceLoadSize *this,Instruction *inst)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  ConstantManager *pCVar2;
  TypeManager *this_01;
  Constant *this_02;
  bool bVar3;
  short sVar4;
  uint32_t uVar5;
  uint32_t id;
  int iVar6;
  uint uVar7;
  Instruction *this_03;
  iterator iVar8;
  Type *pTVar9;
  undefined4 extraout_var;
  const_iterator cVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *pmVar11;
  undefined1 uVar12;
  IRContext *this_04;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> elements_used;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_00 = (pIVar1->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar5 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar5 = (uint)inst->has_result_id_;
  }
  uVar5 = Instruction::GetSingleWordOperand(inst,uVar5);
  this_03 = analysis::DefUseManager::GetDef(this_00,uVar5);
  uVar12 = 0;
  local_60._M_impl._0_4_ = 0;
  if (this_03->opcode_ == OpLoad) {
    if (this_03->has_result_id_ == true) {
      local_60._M_impl._0_4_ =
           Instruction::GetSingleWordOperand(this_03,(uint)this_03->has_type_id_);
    }
    iVar8 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->should_replace_cache_)._M_h,(key_type_conflict *)&local_60);
    if (iVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>._M_cur ==
        (__node_type *)0x0) {
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_80._8_8_ = 0;
      local_68 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp:137:44)>
                 ::_M_invoke;
      local_70 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp:137:44)>
                 ::_M_manager;
      local_80._M_unused._M_object = &local_60;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar3 = analysis::DefUseManager::WhileEachUser
                        (this_00,this_03,(function<bool_(spvtools::opt::Instruction_*)> *)&local_80)
      ;
      if (local_70 != (code *)0x0) {
        (*local_70)(&local_80,&local_80,__destroy_functor);
      }
      uVar5 = 0;
      uVar12 = false;
      if ((bVar3) && (uVar12 = true, this->replacement_threshold_ < 1.0)) {
        pIVar1 = (this->super_Pass).context_;
        sVar4 = (short)pIVar1->valid_analyses_;
        this_04 = pIVar1;
        if ((pIVar1->valid_analyses_ >> 0xe & 1) == 0) {
          IRContext::BuildConstantManager(pIVar1);
          this_04 = (this->super_Pass).context_;
          sVar4 = (short)this_04->valid_analyses_;
        }
        pCVar2 = (pIVar1->constant_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                 _M_head_impl;
        if (-1 < sVar4) {
          IRContext::BuildTypeManager(this_04);
        }
        this_01 = (this_04->type_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl
        ;
        id = 0;
        if (this_03->has_type_id_ == true) {
          id = Instruction::GetSingleWordOperand(this_03,0);
        }
        pTVar9 = analysis::TypeManager::GetType(this_01,id);
        if (pTVar9->kind_ == kStruct) {
          iVar6 = (*pTVar9->_vptr_Type[0x1d])();
          uVar7 = (uint)((ulong)(*(long *)(CONCAT44(extraout_var_01,iVar6) + 0x30) -
                                *(long *)(CONCAT44(extraout_var_01,iVar6) + 0x28)) >> 3);
        }
        else {
          uVar7 = 1;
          if (pTVar9->kind_ == kArray) {
            iVar6 = (*pTVar9->_vptr_Type[0x17])();
            local_80._0_4_ = *(undefined4 *)(CONCAT44(extraout_var,iVar6) + 0x30);
            cVar10 = std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&(pCVar2->id_to_const_val_)._M_h,
                            (key_type_conflict *)local_80._M_pod_data);
            if ((cVar10.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                 ._M_cur == (__node_type *)0x0) ||
               (this_02 = *(Constant **)
                           ((long)cVar10.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                                  ._M_cur + 0x10), this_02 == (Constant *)0x0)) {
              uVar7 = 0xffffffff;
            }
            else {
              iVar6 = (*this_02->_vptr_Constant[0xe])(this_02);
              if (CONCAT44(extraout_var_00,iVar6) == 0) {
                __assert_fail("size_const->AsIntConstant()",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp"
                              ,0xa3,
                              "bool spvtools::opt::ReduceLoadSize::ShouldReplaceExtract(Instruction *)"
                             );
              }
              uVar7 = analysis::Constant::GetU32(this_02);
            }
          }
        }
        uVar12 = (((double)CONCAT44(0x45300000,
                                    (int)(local_60._M_impl.super__Rb_tree_header._M_node_count >>
                                         0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,
                                   (int)local_60._M_impl.super__Rb_tree_header._M_node_count) -
                 4503599627370496.0)) / (double)uVar7 < this->replacement_threshold_;
      }
      if (this_03->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(this_03,(uint)this_03->has_type_id_);
      }
      local_80._0_4_ = uVar5;
      pmVar11 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->should_replace_cache_,(key_type *)local_80._M_pod_data);
      *pmVar11 = (mapped_type)uVar12;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
    }
    else {
      uVar12 = *(undefined1 *)
                ((long)iVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>.
                       _M_cur + 0xc);
    }
  }
  return (bool)uVar12;
}

Assistant:

bool ReduceLoadSize::ShouldReplaceExtract(Instruction* inst) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  Instruction* op_inst = def_use_mgr->GetDef(
      inst->GetSingleWordInOperand(kExtractCompositeIdInIdx));

  if (op_inst->opcode() != spv::Op::OpLoad) {
    return false;
  }

  auto cached_result = should_replace_cache_.find(op_inst->result_id());
  if (cached_result != should_replace_cache_.end()) {
    return cached_result->second;
  }

  bool all_elements_used = false;
  std::set<uint32_t> elements_used;

  all_elements_used =
      !def_use_mgr->WhileEachUser(op_inst, [&elements_used](Instruction* use) {
        if (use->IsCommonDebugInstr()) return true;
        if (use->opcode() != spv::Op::OpCompositeExtract ||
            use->NumInOperands() == 1) {
          return false;
        }
        elements_used.insert(use->GetSingleWordInOperand(1));
        return true;
      });

  bool should_replace = false;
  if (all_elements_used) {
    should_replace = false;
  } else if (1.0 <= replacement_threshold_) {
    should_replace = true;
  } else {
    analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Type* load_type = type_mgr->GetType(op_inst->type_id());
    uint32_t total_size = 1;
    switch (load_type->kind()) {
      case analysis::Type::kArray: {
        const analysis::Constant* size_const =
            const_mgr->FindDeclaredConstant(load_type->AsArray()->LengthId());

        if (size_const) {
          assert(size_const->AsIntConstant());
          total_size = size_const->GetU32();
        } else {
          // The size is spec constant, so it is unknown at this time.  Assume
          // it is very large.
          total_size = UINT32_MAX;
        }
      } break;
      case analysis::Type::kStruct:
        total_size = static_cast<uint32_t>(
            load_type->AsStruct()->element_types().size());
        break;
      default:
        break;
    }
    double percent_used = static_cast<double>(elements_used.size()) /
                          static_cast<double>(total_size);
    should_replace = (percent_used < replacement_threshold_);
  }

  should_replace_cache_[op_inst->result_id()] = should_replace;
  return should_replace;
}